

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
           *this,ComputePipelineStateCreateInfo *CI)

{
  PipelineResourceLayoutDescX *this_00;
  IPipelineStateCache *pPipelineStateCache;
  Uint32 UVar1;
  undefined4 uVar2;
  SHADER_RESOURCE_VARIABLE_TYPE SVar3;
  undefined3 uVar4;
  SHADER_TYPE SVar5;
  Uint32 UVar6;
  undefined4 uVar7;
  long lVar8;
  ComputePipelineStateCreateInfo *pCVar9;
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  *pPVar10;
  size_t i;
  ulong uVar11;
  
  pCVar9 = CI;
  pPVar10 = this;
  for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pPVar10->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    super_DeviceObjectAttribs.Name =
         (pCVar9->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    pCVar9 = (ComputePipelineStateCreateInfo *)
             &(pCVar9->super_PipelineStateCreateInfo).PSODesc.PipelineType;
    pPVar10 = (PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
               *)&(pPVar10->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.
                  PSODesc.PipelineType;
  }
  this_00 = &this->ResourceLayout;
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (this_00,&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout);
  (this->StringPool)._M_h._M_buckets = &(this->StringPool)._M_h._M_single_bucket;
  (this->StringPool)._M_h._M_bucket_count = 1;
  (this->StringPool)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->StringPool)._M_h._M_element_count = 0;
  (this->StringPool)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->StringPool)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->StringPool)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Signatures).
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CopyPSOCreateInternalInfo
            ((Diligent *)&this->InternalData,(CI->super_PipelineStateCreateInfo).pInternalData);
  SetName(this,(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
               super_DeviceObjectAttribs.Name);
  for (uVar11 = 0; uVar11 < (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount;
      uVar11 = uVar11 + 1) {
    AddSignature(this,(CI->super_PipelineStateCreateInfo).ppResourceSignatures[uVar11]);
  }
  pPipelineStateCache = (CI->super_PipelineStateCreateInfo).pPSOCache;
  if (pPipelineStateCache != (IPipelineStateCache *)0x0) {
    SetPipelineStateCache(this,pPipelineStateCache);
  }
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  ImmutableSamplers = (this->ResourceLayout).super_PipelineResourceLayoutDesc.ImmutableSamplers;
  SVar3 = (this_00->super_PipelineResourceLayoutDesc).DefaultVariableType;
  uVar4 = *(undefined3 *)&(this_00->super_PipelineResourceLayoutDesc).field_0x1;
  SVar5 = (this_00->super_PipelineResourceLayoutDesc).DefaultVariableMergeStages;
  UVar6 = (this->ResourceLayout).super_PipelineResourceLayoutDesc.NumVariables;
  uVar7 = *(undefined4 *)&(this->ResourceLayout).super_PipelineResourceLayoutDesc.field_0xc;
  UVar1 = (this->ResourceLayout).super_PipelineResourceLayoutDesc.NumImmutableSamplers;
  uVar2 = *(undefined4 *)&(this->ResourceLayout).super_PipelineResourceLayoutDesc.field_0x1c;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  Variables = (this->ResourceLayout).super_PipelineResourceLayoutDesc.Variables;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumImmutableSamplers = UVar1;
  *(undefined4 *)
   &(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    ResourceLayout.field_0x1c = uVar2;
  pCVar9 = &this->super_ComputePipelineStateCreateInfo;
  (pCVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableType = SVar3;
  *(undefined3 *)&(pCVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.field_0x1 = uVar4;
  (pCVar9->super_PipelineStateCreateInfo).PSODesc.ResourceLayout.DefaultVariableMergeStages = SVar5;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumVariables = UVar6;
  *(undefined4 *)
   &(this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    ResourceLayout.field_0xc = uVar7;
  (this->super_ComputePipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData =
       (this->InternalData)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  return;
}

Assistant:

PipelineStateCreateInfoX(const CreateInfoType& CI) noexcept :
        CreateInfoType{CI},
        ResourceLayout{CI.PSODesc.ResourceLayout},
        InternalData{CopyPSOCreateInternalInfo(CI.pInternalData)}
    {
        SetName(this->PSODesc.Name);
        for (size_t i = 0; i < CI.ResourceSignaturesCount; ++i)
            AddSignature(CI.ppResourceSignatures[i]);
        if (CI.pPSOCache != nullptr)
            SetPipelineStateCache(CI.pPSOCache);
        this->PSODesc.ResourceLayout = ResourceLayout;
        this->pInternalData          = InternalData.get();
    }